

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# candidate_index_impl.h
# Opt level: O0

void __thiscall
candidate_index::CandidateIndex::lookup
          (CandidateIndex *this,
          vector<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>
          *sets_collection,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *join_candidates,
          int number_of_labels,double distance_threshold)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  int iVar7;
  iterator iVar8;
  bool bVar9;
  int iVar10;
  size_type sVar11;
  difference_type dVar12;
  reference pvVar13;
  reference pvVar14;
  pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>
  *ppVar15;
  reference pvVar16;
  reference pvVar17;
  reference pvVar18;
  reference sv_s;
  reference piVar19;
  vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
  *this_00;
  double t;
  double eqoverlap;
  int maxs;
  int maxr;
  size_t ps;
  size_t pr;
  vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
  *s_2;
  iterator iStack_130;
  int m;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  int local_110;
  int local_10c;
  int p_1;
  int tau_valid;
  int pos;
  int set;
  size_t s_1;
  size_t s;
  int i;
  int r_size;
  vector<int,_std::allocator<int>_> M;
  int local_c4;
  undefined1 local_c0 [4];
  int r_id;
  vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
  r;
  pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>
  *r_pair;
  __normal_iterator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_*,_std::vector<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>_>
  local_98;
  iterator r_it;
  size_t p;
  undefined1 local_80 [8];
  vector<candidate_index::SetData,_std::allocator<candidate_index::SetData>_> set_data;
  allocator<candidate_index::InvertedListElement> local_51;
  undefined1 local_50 [8];
  vector<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
  il_index;
  double distance_threshold_local;
  int number_of_labels_local;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *join_candidates_local;
  vector<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>
  *sets_collection_local;
  CandidateIndex *this_local;
  
  il_index.
  super__Vector_base<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)distance_threshold;
  std::allocator<candidate_index::InvertedListElement>::allocator(&local_51);
  std::
  vector<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
  ::vector((vector<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
            *)local_50,(long)number_of_labels,&local_51);
  std::allocator<candidate_index::InvertedListElement>::~allocator(&local_51);
  sVar11 = std::
           vector<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>
           ::size(sets_collection);
  std::allocator<candidate_index::SetData>::allocator
            ((allocator<candidate_index::SetData> *)((long)&p + 7));
  std::vector<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>::vector
            ((vector<candidate_index::SetData,_std::allocator<candidate_index::SetData>_> *)local_80
             ,sVar11,(allocator<candidate_index::SetData> *)((long)&p + 7));
  std::allocator<candidate_index::SetData>::~allocator
            ((allocator<candidate_index::SetData> *)((long)&p + 7));
  r_it._M_current =
       (pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>
        *)0x0;
  local_98._M_current =
       (pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>
        *)std::
          vector<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>
          ::begin(sets_collection);
  do {
    r_pair = (pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>
              *)std::
                vector<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>
                ::end(sets_collection);
    bVar9 = __gnu_cxx::operator!=
                      (&local_98,
                       (__normal_iterator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_*,_std::vector<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>_>
                        *)&r_pair);
    if (!bVar9) {
      std::vector<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>::~vector
                ((vector<candidate_index::SetData,_std::allocator<candidate_index::SetData>_> *)
                 local_80);
      std::
      vector<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
      ::~vector((vector<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                 *)local_50);
      return;
    }
    r.
    super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_*,_std::vector<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>_>
                  ::operator*(&local_98);
    std::
    vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
    ::vector((vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
              *)local_c0,
             (vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
              *)&(r.
                  super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage)->weight_so_far);
    M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)std::
                  vector<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>
                  ::begin(sets_collection);
    dVar12 = __gnu_cxx::operator-
                       (&local_98,
                        (__normal_iterator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_*,_std::vector<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>_>
                         *)&M.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
    local_c4 = (int)dVar12;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&i);
    pvVar13 = std::
              vector<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>
              ::operator[](sets_collection,(long)local_c4);
    s._4_4_ = pvVar13->first;
    if ((double)s._4_4_ <=
        (double)il_index.
                super__Vector_base<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      for (s._0_4_ = 0; (int)s < local_c4; s._0_4_ = (int)s + 1) {
        pvVar14 = std::vector<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>::
                  operator[]((vector<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                              *)local_80,(long)(int)s);
        if (pvVar14->overlap == 0) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)&i,(value_type_conflict2 *)&s);
        }
        pvVar14 = std::vector<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>::
                  operator[]((vector<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                              *)local_80,(long)(int)s);
        pvVar14->overlap = pvVar14->overlap + 1;
      }
    }
    r_it._M_current =
         (pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>
          *)0x0;
    do {
      iVar8._M_current = r_it._M_current;
      ppVar15 = (pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>
                 *)std::
                   vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                   ::size((vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                           *)local_c0);
      if (ppVar15 <= iVar8._M_current) break;
      pvVar16 = std::
                vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                ::operator[]((vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                              *)local_c0,(size_type)r_it._M_current);
      pvVar17 = std::
                vector<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                ::operator[]((vector<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                              *)local_50,(long)pvVar16->id);
      s_1 = (size_t)pvVar17->offset;
      while( true ) {
        sVar6 = s_1;
        pvVar16 = std::
                  vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                  ::operator[]((vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                                *)local_c0,(size_type)r_it._M_current);
        pvVar17 = std::
                  vector<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                  ::operator[]((vector<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                                *)local_50,(long)pvVar16->id);
        sVar11 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                           (&pvVar17->element_list);
        bVar9 = false;
        if (sVar6 < sVar11) {
          pvVar16 = std::
                    vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                    ::operator[]((vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                                  *)local_c0,(size_type)r_it._M_current);
          pvVar17 = std::
                    vector<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                    ::operator[]((vector<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                                  *)local_50,(long)pvVar16->id);
          pvVar18 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                    operator[](&pvVar17->element_list,s_1);
          pvVar13 = std::
                    vector<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>
                    ::operator[](sets_collection,(long)pvVar18->first);
          bVar9 = (double)pvVar13->first <
                  (double)s._4_4_ -
                  (double)il_index.
                          super__Vector_base<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        if (!bVar9) break;
        pvVar16 = std::
                  vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                  ::operator[]((vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                                *)local_c0,(size_type)r_it._M_current);
        pvVar17 = std::
                  vector<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                  ::operator[]((vector<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                                *)local_50,(long)pvVar16->id);
        pvVar17->offset = pvVar17->offset + 1;
        s_1 = s_1 + 1;
      }
      pvVar16 = std::
                vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                ::operator[]((vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                              *)local_c0,(size_type)r_it._M_current);
      pvVar17 = std::
                vector<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                ::operator[]((vector<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                              *)local_50,(long)pvVar16->id);
      _pos = (ulong)pvVar17->offset;
      while( true ) {
        uVar5 = _pos;
        pvVar16 = std::
                  vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                  ::operator[]((vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                                *)local_c0,(size_type)r_it._M_current);
        pvVar17 = std::
                  vector<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                  ::operator[]((vector<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                                *)local_50,(long)pvVar16->id);
        sVar11 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                           (&pvVar17->element_list);
        iVar8 = r_it;
        if (sVar11 <= uVar5) break;
        pvVar16 = std::
                  vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                  ::operator[]((vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                                *)local_c0,(size_type)r_it._M_current);
        pvVar17 = std::
                  vector<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                  ::operator[]((vector<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                                *)local_50,(long)pvVar16->id);
        pvVar18 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                  operator[](&pvVar17->element_list,_pos);
        tau_valid = pvVar18->first;
        pvVar16 = std::
                  vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                  ::operator[]((vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                                *)local_c0,(size_type)r_it._M_current);
        pvVar17 = std::
                  vector<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                  ::operator[]((vector<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                                *)local_50,(long)pvVar16->id);
        pvVar18 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                  operator[](&pvVar17->element_list,_pos);
        p_1 = pvVar18->second;
        this->il_lookups_ = this->il_lookups_ + 1;
        pvVar16 = std::
                  vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                  ::operator[]((vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                                *)local_c0,(size_type)r_it._M_current);
        pvVar13 = std::
                  vector<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>
                  ::operator[](sets_collection,(long)tau_valid);
        sv_s = std::
               vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
               ::operator[](&pvVar13->second,(long)p_1);
        local_10c = structural_mapping(this,pvVar16,sv_s,
                                       (double)il_index.
                                               super__Vector_base<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if ((local_10c != 0) &&
           (pvVar14 = std::
                      vector<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>::
                      operator[]((vector<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                                  *)local_80,(long)tau_valid), pvVar14->overlap == 0)) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)&i,&tau_valid);
        }
        iVar10 = local_10c;
        pvVar14 = std::vector<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>::
                  operator[]((vector<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                              *)local_80,(long)tau_valid);
        pvVar14->overlap = iVar10 + pvVar14->overlap;
        _pos = _pos + 1;
      }
      r_it._M_current =
           (pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>
            *)((long)&(r_it._M_current)->first + 1);
      pvVar16 = std::
                vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                ::operator[]((vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                              *)local_c0,(size_type)iVar8._M_current);
    } while ((double)pvVar16->weight_so_far <=
             (double)il_index.
                     super__Vector_base<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 1.0);
    iVar10 = (int)r_it._M_current;
    pvVar14 = std::vector<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>::
              operator[]((vector<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                          *)local_80,(long)local_c4);
    pvVar14->prefix = iVar10;
    sVar11 = std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)&i);
    this->pre_candidates_ = sVar11 + this->pre_candidates_;
    for (local_110 = 0; iVar10 = local_110,
        pvVar14 = std::vector<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>::
                  operator[]((vector<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                              *)local_80,(long)local_c4), iVar10 < pvVar14->prefix;
        local_110 = local_110 + 1) {
      pvVar16 = std::
                vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                ::operator[]((vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                              *)local_c0,(long)local_110);
      pvVar17 = std::
                vector<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                ::operator[]((vector<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                              *)local_50,(long)pvVar16->id);
      __range2 = (vector<int,_std::allocator<int>_> *)
                 std::make_pair<int&,int&>(&local_c4,&local_110);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                (&pvVar17->element_list,(value_type *)&__range2);
    }
    __end2 = std::vector<int,_std::allocator<int>_>::begin((vector<int,_std::allocator<int>_> *)&i);
    iStack_130 = std::vector<int,_std::allocator<int>_>::end
                           ((vector<int,_std::allocator<int>_> *)&i);
    while (bVar9 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffffed0), bVar9) {
      piVar19 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&__end2);
      s_2._4_4_ = *piVar19;
      pvVar13 = std::
                vector<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>
                ::operator[](sets_collection,(long)s_2._4_4_);
      this_00 = &pvVar13->second;
      ps = 0;
      _maxs = 0;
      pvVar14 = std::vector<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>::
                operator[]((vector<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                            *)local_80,(long)local_c4);
      pvVar16 = std::
                vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                ::operator[]((vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                              *)local_c0,(long)(pvVar14->prefix + -1));
      iVar10 = pvVar16->id;
      pvVar14 = std::vector<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>::
                operator[]((vector<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                            *)local_80,(long)s_2._4_4_);
      pvVar16 = std::
                vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                ::operator[](this_00,(long)(pvVar14->prefix + -1));
      if (pvVar16->id < iVar10) {
        while( true ) {
          pvVar16 = std::
                    vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                    ::operator[]((vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                                  *)local_c0,ps);
          iVar10 = pvVar16->weight_so_far;
          pvVar14 = std::vector<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                    ::operator[]((vector<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                                  *)local_80,(long)s_2._4_4_);
          bVar9 = false;
          if (iVar10 < pvVar14->overlap) {
            sVar11 = std::
                     vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                     ::size((vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                             *)local_c0);
            bVar9 = ps < sVar11;
          }
          if (!bVar9) break;
          ps = ps + 1;
        }
        ps = ps + 1;
        pvVar14 = std::vector<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>::
                  operator[]((vector<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                              *)local_80,(long)s_2._4_4_);
        _maxs = (ulong)pvVar14->prefix;
      }
      else {
        pvVar14 = std::vector<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>::
                  operator[]((vector<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                              *)local_80,(long)local_c4);
        ps = (size_t)pvVar14->prefix;
        while( true ) {
          pvVar16 = std::
                    vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                    ::operator[](this_00,_maxs);
          iVar10 = pvVar16->weight_so_far;
          pvVar14 = std::vector<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                    ::operator[]((vector<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                                  *)local_80,(long)s_2._4_4_);
          bVar9 = false;
          if (iVar10 < pvVar14->overlap) {
            sVar11 = std::
                     vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                     ::size(this_00);
            bVar9 = _maxs < sVar11;
          }
          if (!bVar9) break;
          _maxs = _maxs + 1;
        }
        _maxs = _maxs + 1;
      }
      iVar7 = s._4_4_;
      pvVar16 = std::
                vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                ::operator[]((vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                              *)local_c0,ps - 1);
      iVar10 = pvVar16->weight_so_far;
      pvVar14 = std::vector<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>::
                operator[]((vector<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                            *)local_80,(long)s_2._4_4_);
      iVar1 = pvVar14->overlap;
      pvVar13 = std::
                vector<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>
                ::operator[](sets_collection,(long)s_2._4_4_);
      iVar2 = pvVar13->first;
      pvVar16 = std::
                vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                ::operator[](this_00,_maxs - 1);
      iVar3 = pvVar16->weight_so_far;
      pvVar14 = std::vector<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>::
                operator[]((vector<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                            *)local_80,(long)s_2._4_4_);
      iVar4 = pvVar14->overlap;
      t = (double)s._4_4_ -
          (double)il_index.
                  super__Vector_base<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pvVar14 = std::vector<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>::
                operator[]((vector<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                            *)local_80,(long)s_2._4_4_);
      bVar9 = structural_filter(this,(vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                                      *)local_c0,this_00,t,pvVar14->overlap,(int)ps,maxs,
                                (int)(double)il_index.
                                             super__Vector_base<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (iVar7 - iVar10) + iVar1,(iVar2 - iVar3) + iVar4);
      if (bVar9) {
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int&>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)join_candidates,
                   &local_c4,(int *)((long)&s_2 + 4));
      }
      pvVar14 = std::vector<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>::
                operator[]((vector<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                            *)local_80,(long)s_2._4_4_);
      pvVar14->overlap = 0;
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&i);
    std::
    vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
    ::~vector((vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
               *)local_c0);
    __gnu_cxx::
    __normal_iterator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_*,_std::vector<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>_>
    ::operator++(&local_98);
  } while( true );
}

Assistant:

void CandidateIndex::lookup(
    std::vector<std::pair<int, std::vector<label_set_converter::LabelSetElement>>>& sets_collection,
    std::vector<std::pair<int, int>>& join_candidates,
    const int number_of_labels, 
    const double distance_threshold) {
  // inverted list index.
  std::vector<candidate_index::InvertedListElement> il_index(number_of_labels);
  // containing specific data of a set. (e.g. actual overlap, index prefix)
  std::vector<candidate_index::SetData> set_data(sets_collection.size());
  // position in label set while processing r
  std::size_t p = 0;

  // iterate through all sets in the given collection
  std::vector<std::pair<int, std::vector<label_set_converter::LabelSetElement>>>::iterator r_it = sets_collection.begin();
  for (; r_it != sets_collection.end(); ++r_it) {
    std::pair<int, std::vector<label_set_converter::LabelSetElement>>& r_pair = *r_it; // dereference iterator to current set once
    std::vector<label_set_converter::LabelSetElement> r = r_pair.second; // dereference iterator to current set once
    int r_id = r_it - sets_collection.begin(); // identifier for r (line number)
    std::vector<int> M; // holds the set identifiers of the candidate pairs, 
                                 // the overlap is stored in the set_data
    int r_size = sets_collection[r_id].first; // number of elements in r

    // *****************************
    // ** Generate pre candidates **
    // *****************************
    // add all small trees that does not have to share a common label in the prefix
    if(r_size <= distance_threshold) 
      for(int i = 0; i < r_id; ++i) {
        if(set_data[i].overlap == 0) 
          M.push_back(i); // if not, add it to the candidate set M
        ++set_data[i].overlap; // increase overlap for set i
      }

    // iterate through probing prefix elements and extend the candidate set
    p = 0;
    // until tau + 1 nodes of the probing set are processed
    while(p < r.size()) {
      // remove all entries in the inverted list index up to the position where 
      // the size is greater than the lower bound
      for(std::size_t s = il_index[r[p].id].offset; s < il_index[r[p].id].element_list.size() &&
          sets_collection[il_index[r[p].id].element_list[s].first].first < r_size - distance_threshold; s++)
        ++il_index[r[p].id].offset;

      // iterate through all remaining sets for the current token r[p] in the 
      // inverted list index and add them to the candidates
      for(std::size_t s = il_index[r[p].id].offset; s < il_index[r[p].id].element_list.size(); s++) {
        int set = il_index[r[p].id].element_list[s].first;
        int pos = il_index[r[p].id].element_list[s].second;
        // increase the number of lookups in the inverted list
        ++il_lookups_;

        int tau_valid = structural_mapping(r[p], sets_collection[set].second[pos], distance_threshold);
        if(tau_valid != 0 && set_data[set].overlap == 0) 
          M.push_back(set); // if not, add it to the candidate set M
        set_data[set].overlap += tau_valid;
        
      }
      // stop as soon as tau + 1 elements have been discovered
      p++;
      if(r[p-1].weight_so_far > distance_threshold + 1)
        break;
    }

    // store last postition of the index of the label set
    set_data[r_id].prefix = p;
    // count number of precandidates
    pre_candidates_ += M.size();
    
    // add all elements in the prefix of r in the inverted list
    for(int p = 0; p < set_data[r_id].prefix; p++)
      il_index[r[p].id].element_list.push_back(std::make_pair(r_id, p));

    // *****************************
    // *** Verify pre candidates ***
    // *****************************
    // compute structural filter for each candidate (r, s) in M
    for (int m: M) {
      std::vector<label_set_converter::LabelSetElement>& s = sets_collection[m].second;
      // prefix positions for sets r and s in the candidate pair
      std::size_t pr = 0, ps = 0;

      // check last prefix position; the smaller one starts at prefix position, 
      // the greater one starts at the overlap
      if (r[set_data[r_id].prefix-1].id > s[set_data[m].prefix-1].id) {
        for(; r[pr].weight_so_far < set_data[m].overlap && pr < r.size(); ++pr) {}
        ++pr;
        ps = set_data[m].prefix;
      } else {
        pr = set_data[r_id].prefix;
        for(; s[ps].weight_so_far < set_data[m].overlap && ps < s.size(); ++ps) {}
        ++ps;
      }

      int maxr = r_size - r[pr-1].weight_so_far + set_data[m].overlap;
      int maxs = sets_collection[m].first - s[ps-1].weight_so_far + set_data[m].overlap;

      // overlap needed for threshold tau between r and s
      const double eqoverlap = r_size - distance_threshold;

      // verify if r and s belong to the resultset, computed the structural filter
      if (structural_filter(r, s, eqoverlap, set_data[m].overlap, pr, ps, distance_threshold, maxr, maxs))
        join_candidates.emplace_back(r_id, m);

      // reset overlap in set_data
      set_data[m].overlap = 0;
    }
  }
}